

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O2

void __thiscall
Encapsulation_encapsulatedComponentMethods_Test::~Encapsulation_encapsulatedComponentMethods_Test
          (Encapsulation_encapsulatedComponentMethods_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Encapsulation, encapsulatedComponentMethods)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();
    libcellml::ComponentPtr c4 = libcellml::Component::create();
    libcellml::ComponentPtr c5 = libcellml::Component::create();
    libcellml::ComponentPtr c6 = libcellml::Component::create();
    libcellml::ComponentPtr c4n = libcellml::Component::create();

    c1->setName("comp1");
    c2->setName("comp2");
    c3->setName("comp3");
    c4->setName("comp4");
    c5->setName("comp5");
    c6->setName("comp6");
    c4n->setName("comp4new");

    c->addComponent(c1);
    c1->addComponent(c2);
    c2->addComponent(c3);
    c3->addComponent(c4);
    c4->addComponent(c5);
    c5->addComponent(c6);

    // Contains component
    EXPECT_TRUE(c->containsComponent("comp5"));
    // Get component
    EXPECT_EQ(c4, c->component("comp4"));
    const libcellml::ComponentPtr constC4 = c->component("comp4");
    EXPECT_EQ("comp4", constC4->name());
    EXPECT_FALSE(c->containsComponent("invalid"));
    const libcellml::ComponentPtr &const_c = c;
    EXPECT_EQ(const_c->component("invalid"), nullptr);
    EXPECT_FALSE(c->containsComponent("comp4new"));
    EXPECT_EQ(const_c->component("comp4new"), nullptr);
    // Replace component
    c->replaceComponent("comp4", c4n);
    c4n->addComponent(c5);
    EXPECT_EQ(c4n, c->component("comp4new"));
    // Take component
    libcellml::ComponentPtr c6take = c->takeComponent("comp6");
    EXPECT_EQ(c6, c6take);
    // Remove component
    c->removeComponent("comp5");
    c->removeComponent(c4n);
    EXPECT_FALSE(c->containsComponent("comp5"));
    EXPECT_FALSE(c->containsComponent("comp4new"));
}